

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

TPM_RC Initialize_TPM_Codec(TSS_DEVICE *tpm)

{
  TPM_COMM_TYPE TVar1;
  TPM_RC rc;
  TPM_COMM_HANDLE handle;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  int iVar4;
  TPM_RC TVar5;
  
  if (tpm == (TSS_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x101;
    }
    pcVar3 = "Invalid parameter tpm is NULL";
    iVar4 = 0xfb;
  }
  else {
    handle = tpm_comm_create(tpm->comms_endpoint);
    tpm->tpm_comm_handle = handle;
    if (handle != (TPM_COMM_HANDLE)0x0) {
      TVar1 = tpm_comm_get_type(handle);
      TVar5 = 0;
      if (TVar1 == TPM_COMM_TYPE_EMULATOR) {
        rc = TPM2_Startup(tpm,0);
        TVar5 = 0;
        if ((rc & 0xfffffeff) != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar3 = TSS_StatusValueName(rc);
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                      ,"Initialize_TPM_Codec",0x10b,1,"calling TPM2_Startup %s",pcVar3);
          }
          tpm_comm_destroy(tpm->tpm_comm_handle);
          TVar5 = rc;
        }
      }
      TPM2_FlushContext(tpm,0x3000000);
      TPM2_FlushContext(tpm,0x3000001);
      TPM2_FlushContext(tpm,0x3000002);
      return TVar5;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x101;
    }
    pcVar3 = "creating tpm_comm object";
    iVar4 = 0x100;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
            ,"Initialize_TPM_Codec",iVar4,1,pcVar3);
  return 0x101;
}

Assistant:

TPM_RC Initialize_TPM_Codec(TSS_DEVICE* tpm)
{
    TPM_RC result;
    if (tpm == NULL)
    {
        LogError("Invalid parameter tpm is NULL");
        result = TPM_RC_FAILURE;
    }
    else if ( (tpm->tpm_comm_handle = tpm_comm_create(tpm->comms_endpoint)) == NULL)
    {
        LogError("creating tpm_comm object");
        result = TPM_RC_FAILURE;
    }
    else
    {
        TPM_COMM_TYPE comm_type = tpm_comm_get_type(tpm->tpm_comm_handle);
        if (comm_type == TPM_COMM_TYPE_EMULATOR)
        {
            result = TPM2_Startup(tpm, TPM_SU_CLEAR);
            if (result != TPM_RC_SUCCESS && result != TPM_RC_INITIALIZE)
            {
                LogError("calling TPM2_Startup %s", TSS_StatusValueName(result) );
                tpm_comm_destroy(tpm->tpm_comm_handle);
            }
            else
            {
                result = TPM_RC_SUCCESS;
            }
        }
        else
        {
            result = TPM_RC_SUCCESS;
        }
        // Clear out from previous runs
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION);
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION | 1);
        (void)TPM2_FlushContext(tpm, HR_POLICY_SESSION | 2);
    }
    return result;
}